

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O2

void __thiscall
prometheus::Histogram::ObserveMultiple
          (Histogram *this,vector<double,_std::allocator<double>_> *bucket_increments,
          double sum_of_values)

{
  pointer pCVar1;
  length_error *this_00;
  long lVar2;
  size_t i;
  ulong uVar3;
  
  if ((long)(bucket_increments->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(bucket_increments->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start ==
      (long)(this->bucket_counts_).
            super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->bucket_counts_).
            super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>._M_impl.
            super__Vector_impl_data._M_start) {
    std::mutex::lock(&this->mutex_);
    Gauge::Increment(&this->sum_,sum_of_values);
    lVar2 = 0;
    for (uVar3 = 0;
        pCVar1 = (this->bucket_counts_).
                 super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)(this->bucket_counts_).
                              super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 3);
        uVar3 = uVar3 + 1) {
      Counter::Increment((Counter *)((long)&(pCVar1->gauge_).value_._M_i + lVar2),
                         *(double *)
                          ((long)(bucket_increments->
                                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                 super__Vector_impl_data._M_start + lVar2));
      lVar2 = lVar2 + 8;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    return;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error
            (this_00,
             "The size of bucket_increments was not equal tothe number of buckets in the histogram."
            );
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

void Histogram::ObserveMultiple(const std::vector<double>& bucket_increments,
                                const double sum_of_values) {
  if (bucket_increments.size() != bucket_counts_.size()) {
    throw std::length_error(
        "The size of bucket_increments was not equal to"
        "the number of buckets in the histogram.");
  }

  std::lock_guard<std::mutex> lock(mutex_);
  sum_.Increment(sum_of_values);

  for (std::size_t i{0}; i < bucket_counts_.size(); ++i) {
    bucket_counts_[i].Increment(bucket_increments[i]);
  }
}